

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

int use_pole(obj *obj)

{
  char cVar1;
  byte bVar2;
  monst *pmVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  char *line;
  coord cc;
  coord local_2a;
  
  if ((u._1052_1_ & 1) != 0) {
    pline("There\'s not enough room here to use that.");
    return 0;
  }
  iVar10 = 0;
  if (uwep != obj) {
    bVar4 = wield_tool(obj,"swing");
    iVar10 = 1;
    if (bVar4 == '\0') {
      return 0;
    }
  }
  pline("Where do you want to hit?");
  local_2a.x = u.ux;
  local_2a.y = u.uy;
  iVar5 = getpos(&local_2a,'\0',"the spot to hit");
  if (iVar5 < 0) {
    return 0;
  }
  iVar5 = uwep_skill_type();
  iVar9 = 4;
  if ((iVar5 != 0) && (cVar1 = u.weapon_skills[iVar5].skill, '\x02' < cVar1)) {
    iVar9 = (uint)(cVar1 != '\x03') + (uint)(cVar1 != '\x03') * 2 + 5;
  }
  iVar5 = dist2((int)local_2a.x,(int)local_2a.y,(int)u.ux,(int)u.uy);
  if (iVar9 < iVar5) {
    line = "Too far!";
    goto LAB_00149261;
  }
  iVar5 = dist2((int)local_2a.x,(int)local_2a.y,(int)u.ux,(int)u.uy);
  if (iVar5 < 4) {
    line = "Too close!";
    goto LAB_00149261;
  }
  lVar7 = (long)local_2a.y;
  lVar8 = (long)local_2a.x;
  bVar2 = viz_array[lVar7][lVar8];
  if ((bVar2 & 2) == 0) {
    pmVar3 = level->monsters[lVar8][lVar7];
    if ((pmVar3 != (monst *)0x0) && (uVar6 = *(uint *)&pmVar3->field_0x60, (uVar6 >> 9 & 1) == 0)) {
      if (pmVar3->wormno == '\0') {
        if ((viz_array[pmVar3->my][pmVar3->mx] & 2U) != 0) goto LAB_001491ed;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014918a;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00149181;
        }
        else {
LAB_00149181:
          if (ublindf == (obj *)0x0) goto LAB_0014925a;
LAB_0014918a:
          if (ublindf->oartifact != '\x1d') goto LAB_0014925a;
        }
        if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) ||
            ((viz_array[pmVar3->my][pmVar3->mx] & 1U) == 0)) ||
           ((pmVar3->data->mflags3 & 0x200) == 0)) goto LAB_0014925a;
      }
      else {
        bVar4 = worm_known(level,pmVar3);
        if (bVar4 == '\0') goto LAB_0014925a;
        uVar6 = *(uint *)&pmVar3->field_0x60;
      }
LAB_001491ed:
      if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar6 & 0x280) == 0) goto LAB_0014922a;
      }
      else if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0014922a:
        if ((u._1052_1_ & 0x20) == 0) {
          lVar7 = (long)local_2a.y;
          lVar8 = (long)local_2a.x;
          bVar2 = viz_array[lVar7][lVar8];
          goto LAB_0014924b;
        }
      }
    }
LAB_0014925a:
    line = "You won\'t hit anything if you can\'t see that spot.";
  }
  else {
LAB_0014924b:
    if ((bVar2 & 1) != 0) {
      pmVar3 = level->monsters[lVar8][lVar7];
      if ((pmVar3 != (monst *)0x0) && ((pmVar3->field_0x61 & 2) == 0)) {
        iVar10 = pmVar3->mhp;
        bhitpos = local_2a;
        check_caitiff(pmVar3);
        thitmonst(pmVar3,uwep,(obj *)0x0);
        if (iVar10 <= pmVar3->mhp) {
          return 1;
        }
        u.uconduct.weaphit = u.uconduct.weaphit + 1;
        return 1;
      }
      pline("Nothing happens.");
      return 1;
    }
    line = "You can\'t reach that spot from here.";
  }
LAB_00149261:
  pline(line);
  return iVar10;
}

Assistant:

static int use_pole (struct obj *obj)
{
	int res = 0, typ, max_range = 4, min_range = 4;
	coord cc;
	struct monst *mtmp;


	/* Are you allowed to use the pole? */
	if (u.uswallow) {
	    pline(not_enough_room);
	    return 0;
	}
	if (obj != uwep) {
	    if (!wield_tool(obj, "swing")) return 0;
	    else res = 1;
	}
     /* assert(obj == uwep); */

	/* Prompt for a location */
	pline(where_to_hit);
	cc.x = u.ux;
	cc.y = u.uy;
	if (getpos(&cc, FALSE, "the spot to hit") < 0)
	    return 0;	/* user pressed ESC */

	/* Calculate range */
	typ = uwep_skill_type();
	if (typ == P_NONE || P_SKILL(typ) <= P_BASIC) max_range = 4;
	else if (P_SKILL(typ) == P_SKILLED) max_range = 5;
	else max_range = 8;
	if (distu(cc.x, cc.y) > max_range) {
	    pline("Too far!");
	    return res;
	} else if (distu(cc.x, cc.y) < min_range) {
	    pline("Too close!");
	    return res;
	} else if (!cansee(cc.x, cc.y) &&
		   ((mtmp = m_at(level, cc.x, cc.y)) == NULL ||
		    !canseemon(level, mtmp))) {
	    pline(cant_see_spot);
	    return res;
	} else if (!couldsee(cc.x, cc.y)) { /* Eyes of the Overworld */
	    pline(cant_reach);
	    return res;
	}

	/* Attack the monster there */
	if ((mtmp = m_at(level, cc.x, cc.y)) != NULL) {
	    int oldhp = mtmp->mhp;

	    bhitpos = cc;
	    check_caitiff(mtmp);
	    thitmonst(mtmp, uwep, NULL);
	    /* check the monster's HP because thitmonst() doesn't return
	     * an indication of whether it hit.  Not perfect (what if it's a
	     * non-silver weapon on a shade?)
	     */
	    if (mtmp->mhp < oldhp)
		u.uconduct.weaphit++;
	} else
	    /* Now you know that nothing is there... */
	    pline("Nothing happens.");
	return 1;
}